

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

bool ReadImage(string *path,shared_ptr<Disk> *disk,bool normalise)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Compress CVar8;
  mapped_type *pmVar9;
  string *psVar10;
  string *psVar11;
  long lVar12;
  exception *this;
  DEVICE_ENTRY *pDVar13;
  IMAGE_ENTRY *pIVar14;
  MemFile file;
  string local_e0;
  Compress local_bc;
  key_type local_b8;
  MemFile local_98;
  
  paVar1 = &local_98.m_path.field_2;
  local_98.m_path._M_string_length = 0;
  local_98.m_path.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.m_filename.field_2;
  local_98.m_filename._M_string_length = 0;
  local_98.m_filename.field_2._M_local_buf[0] = '\0';
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.m_it._M_current = (uchar *)0x0;
  local_98.m_compress = None;
  local_98.m_path._M_dataplus._M_p = (pointer)paVar1;
  local_98.m_filename._M_dataplus._M_p = (pointer)paVar2;
  if (path->_M_string_length == 0) {
    this = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[19]>(this,(char (*) [19])"invalid empty path");
    goto LAB_001612d9;
  }
  pDVar13 = aDeviceTypes;
  bVar5 = false;
  do {
    if (pDVar13->pszType == (char *)0x0) {
      bVar6 = IsDir(path);
      if (bVar6) {
        this = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20]>(this,(char (*) [20])"path is a directory");
        goto LAB_001612d9;
      }
      iVar7 = MemFile::open(&local_98,(char *)path,(uint)(opt.nozip == 0));
      if ((char)iVar7 == '\0') {
        bVar5 = false;
        goto LAB_0016121e;
      }
      if (bVar5 != false) goto LAB_001610b2;
      pIVar14 = aImageTypes;
      goto LAB_00161088;
    }
    if (pDVar13->pfnRead != (DEVICE_READFUNC)0x0) {
      bVar5 = (*pDVar13->pfnRead)(path,disk);
    }
    pDVar13 = pDVar13 + 1;
  } while (bVar5 == false);
  goto LAB_00160ff5;
  while( true ) {
    if (pIVar14->pfnRead != (IMAGE_READFUNC)0x0) {
      bVar5 = (*pIVar14->pfnRead)(&local_98,disk);
    }
    pIVar14 = pIVar14 + 1;
    if (bVar5 != false) break;
LAB_00161088:
    if (pIVar14->pszType == (char *)0x0) goto LAB_00160ff5;
  }
LAB_001610b2:
  CVar8 = MemFile::compression(&local_98);
  if (CVar8 != None) {
    local_bc = MemFile::compression(&local_98);
    to_string_abi_cxx11_(&local_e0,&local_bc);
    peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"archive","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->metadata,&local_b8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar10 = MemFile::path_abi_cxx11_(&local_98);
  psVar11 = MemFile::name_abi_cxx11_(&local_98);
  lVar12 = std::__cxx11::string::rfind
                     ((char *)psVar10,(ulong)(psVar11->_M_dataplus)._M_p,0xffffffffffffffff);
  psVar10 = MemFile::name_abi_cxx11_(&local_98);
  sVar4 = psVar10->_M_string_length;
  psVar10 = MemFile::path_abi_cxx11_(&local_98);
  if (sVar4 + lVar12 != psVar10->_M_string_length) {
    MemFile::name_abi_cxx11_(&local_98);
    peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"filename","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->metadata,&local_e0);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00160ff5:
  if (bVar5 != false) {
    bVar5 = true;
    if (normalise) {
      if (opt.fix == 1) {
        FixPlus3BootLoader(disk);
      }
      if (opt.flip != 0) {
        Disk::flip_sides((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      }
    }
LAB_0016121e:
    if (local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.m_data.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.m_data.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_98.m_filename._M_dataplus._M_p,
                      CONCAT71(local_98.m_filename.field_2._M_allocated_capacity._1_7_,
                               local_98.m_filename.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_path._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.m_path._M_dataplus._M_p,
                      CONCAT71(local_98.m_path.field_2._M_allocated_capacity._1_7_,
                               local_98.m_path.field_2._M_local_buf[0]) + 1);
    }
    return bVar5;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[31]>
            (this,(char (*) [31])"unrecognised disk image format");
LAB_001612d9:
  __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadImage(const std::string& path, std::shared_ptr<Disk>& disk, bool normalise)
{
    MemFile file;
    bool f = false;

    if (path.empty())
        throw util::exception("invalid empty path");

    // Try devices first as the path may use a custom syntax
    for (auto p = aDeviceTypes; !f && p->pszType; ++p)
    {
        if (p->pfnRead) f = p->pfnRead(path, disk);
    }

    if (!f && IsDir(path))
        throw util::exception("path is a directory");

    // Next try regular files (and archives)
    if (!f)
    {
        if (!file.open(path, !opt.nozip))
            return false;

        // Present the image to all types with read support
        for (auto p = aImageTypes; !f && p->pszType; ++p)
        {
            if (p->pfnRead) f = p->pfnRead(file, disk);
        }

        // Store the archive type the image was found in, if any
        if (f)
        {
            if (file.compression() != Compress::None)
                disk->metadata["archive"] = to_string(file.compression());
            if (file.path().rfind(file.name()) + file.name().size() != file.path().size())
                disk->metadata["filename"] = file.name();
        }
    }

#if 0
    // Unwrap any sub-containers
    if (!f) f = UnwrapSDF(olddisk, disk);   // MakeSDF image
    if (!f) f = UnwrapCPM(olddisk, disk);   // BDOS CP/M record format
#endif

    if (!f)
        throw util::exception("unrecognised disk image format");

    if (normalise)
    {
        // ToDo: Make resize and flip optional?  replace fNormalise) and fLoadFilter_?
#if 0 // breaks with sub-ranges
        if (!opt.range.empty())
            disk->resize(opt.range.cyls(), opt.range.heads());
#endif
        // Forcibly correct +3 boot loader problems?
        if (opt.fix == 1)
            FixPlus3BootLoader(disk);

        if (opt.flip)
            disk->flip_sides();
    }

#if 0
    auto cyls = disk->cyls(), heads = disk->heads();
    for (uint8_t head = 0; head < heads; ++head)
    {
        // Determine any forced head value for sectors on this track (-1 for none)
        int nHeadVal = head ? opt.head1 : opt.head0;

        // If nothing forced and we're using a regular format, use its head values
        if (nHeadVal == -1 && olddisk->format.sectors)
            nHeadVal = head ? olddisk->format.head1 : olddisk->format.head0;

        for (uint8_t cyl = 0; cyl < cyls; ++cyl)
        {
            PTRACK pt = disk->GetTrack(cyl, head);

            // Optionally normalise the track, to allow 'scan' to normalise on the fly
            if (fNormalise_)
                pt->Normalise(fLoadFilter_);

            // Forced head?
            if (nHeadVal != -1)
            {
                for (int i = 0; i < pt->sectors; ++i)
                    pt->sector[i].head = nHeadVal;
            }
        }
    }
#endif

    return f;
}